

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O0

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  ulong uStack_20;
  int r;
  size_t i;
  uv_stream_t *handle_local;
  
  bytes_written = 0;
  bytes_read = 0;
  for (uStack_20 = 0; uStack_20 < 0x100; uStack_20 = uStack_20 + 1) {
    do_write(handle);
  }
  iVar1 = uv_read_start(handle,alloc_cb,read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x7c,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_run(handle->loop,UV_RUN_DEFAULT);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x7f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (bytes_written != 0x600000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x81,"bytes_written","==","(256 * 3 * 0x2000)",bytes_written,"==",0x600000);
    abort();
  }
  if (bytes_read != 0x600000) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
            ,0x82,"bytes_read","==","(256 * 3 * 0x2000)",bytes_read,"==",0x600000);
    abort();
  }
  return;
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT_OK(r);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(bytes_written, XFER_SIZE);
  ASSERT_EQ(bytes_read, XFER_SIZE);
}